

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTestsNamesOnly(Config *config)

{
  int iVar1;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar2;
  size_t sVar3;
  pointer pTVar4;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  
  iVar1 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  testCases = getAllTestCasesSorted(&config->super_IConfig);
  filterTests(&matchedTestCases,testCases,(TestSpec *)CONCAT44(extraout_var,iVar1),
              &config->super_IConfig);
  sVar3 = 0;
  for (pTVar4 = matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start;
      pTVar4 != matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_finish; pTVar4 = pTVar4 + 1) {
    if (((pTVar4->super_TestCaseInfo).name._M_string_length == 0) ||
       (*(pTVar4->super_TestCaseInfo).name._M_dataplus._M_p != '#')) {
      std::operator<<((ostream *)&std::cout,(string *)pTVar4);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,'\"');
      poVar2 = std::operator<<(poVar2,(string *)pTVar4);
      std::operator<<(poVar2,'\"');
    }
    iVar1 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x1a])(config);
    if (1 < iVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\t@");
      operator<<((ostream *)poVar2,&(pTVar4->super_TestCaseInfo).lineInfo);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    sVar3 = sVar3 + 1;
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&matchedTestCases);
  return sVar3;
}

Assistant:

std::size_t listTestsNamesOnly( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        std::size_t matchedTests = 0;
        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCaseInfo : matchedTestCases ) {
            matchedTests++;
            if( startsWith( testCaseInfo.name, '#' ) )
               Catch::cout() << '"' << testCaseInfo.name << '"';
            else
               Catch::cout() << testCaseInfo.name;
            if ( config.verbosity() >= Verbosity::High )
                Catch::cout() << "\t@" << testCaseInfo.lineInfo;
            Catch::cout() << std::endl;
        }
        return matchedTests;
    }